

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

token * __thiscall libchars::commands::find_key(commands *this,char *name)

{
  token *ptVar1;
  token *ptVar2;
  bool bVar3;
  token **pptVar4;
  
  if ((name != (char *)0x0) && (this->cmd != (command *)0x0)) {
    pptVar4 = &this->t_par;
    while (ptVar1 = *pptVar4, ptVar1 != (token *)0x0) {
      bVar3 = std::operator!=(&ptVar1->name,name);
      if ((!bVar3) && (ptVar1->ttype == KEY)) {
        ptVar2 = ptVar1->next;
        if ((ptVar2 != (token *)0x0) && (ptVar2->ttype == KEY)) {
          if ((ptVar2->status & 0x800) != 0) {
            return ptVar1;
          }
          return (token *)0x0;
        }
        return (token *)0x0;
      }
      pptVar4 = &ptVar1->next;
    }
  }
  return (token *)0x0;
}

Assistant:

token *commands::find_key(const char *name)
    {
        if (name == NULL)
            return NULL;
        if (cmd == NULL)
            return NULL;

        token *T = t_par;
        while (T != NULL && (T->name != name || T->ttype != token::KEY))
            T = T->next;

        if (T != NULL) {
            if (T->next == NULL)
                return NULL; // {key,value} pair missing 'value'
            else if (T->next->ttype != token::KEY)
                return NULL; // {key,value} pair missing 'value'
            else if (!(T->next->status & token::IS_VALUE))
                return NULL; // {key,value} pair invalid 'value'
        }

        return T;
    }